

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReorderFunctions.cpp
# Opt level: O0

void __thiscall wasm::CallCountScanner::~CallCountScanner(CallCountScanner *this)

{
  CallCountScanner *this_local;
  
  ~CallCountScanner(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }